

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O1

void __thiscall
wasm::
SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::UnorderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
::insert(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::UnorderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
         *this,LocalSet **x)

{
  unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
  *puVar1;
  InsertResult IVar2;
  __hashtable *__h;
  long lVar3;
  __hashtable *__h_1;
  _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  __node_gen_type __node_gen;
  
  if ((this->flexible)._M_h._M_element_count == 0) {
    IVar2 = UnorderedFixedStorage<wasm::LocalSet_*,_2UL>::insert(&this->fixed,x);
    if (IVar2 == CouldNotInsert) {
      if ((this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used != 2) {
        __assert_fail("fixed.used == N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa7,
                      "void wasm::SmallSetBase<wasm::LocalSet *, 2, wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>, std::unordered_set<wasm::LocalSet *>>::insert(const T &) [T = wasm::LocalSet *, N = 2, FixedStorage = wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>, FlexibleSet = std::unordered_set<wasm::LocalSet *>]"
                     );
      }
      if ((this->flexible)._M_h._M_element_count != 0) {
        __assert_fail("flexible.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa8,
                      "void wasm::SmallSetBase<wasm::LocalSet *, 2, wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>, std::unordered_set<wasm::LocalSet *>>::insert(const T &) [T = wasm::LocalSet *, N = 2, FixedStorage = wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>, FlexibleSet = std::unordered_set<wasm::LocalSet *>]"
                     );
      }
      puVar1 = &this->flexible;
      lVar3 = 8;
      local_38 = (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar1;
      do {
        std::
        _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<wasm::LocalSet*&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalSet*,false>>>>
                  ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)puVar1,
                   (long)(this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
                         _M_elems + lVar3 + -8,&local_38);
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x18);
      local_38 = (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar1;
      std::
      _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<wasm::LocalSet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalSet*,false>>>>
                ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar1,x);
      if ((this->flexible)._M_h._M_element_count == 0) {
        __assert_fail("!usingFixed()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xac,
                      "void wasm::SmallSetBase<wasm::LocalSet *, 2, wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>, std::unordered_set<wasm::LocalSet *>>::insert(const T &) [T = wasm::LocalSet *, N = 2, FixedStorage = wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>, FlexibleSet = std::unordered_set<wasm::LocalSet *>]"
                     );
      }
      (this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used = 0;
    }
  }
  else {
    local_38 = (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->flexible;
    std::
    _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<wasm::LocalSet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalSet*,false>>>>
              (local_38,x);
  }
  return;
}

Assistant:

void insert(const T& x) {
    if (usingFixed()) {
      if (fixed.insert(x) == FixedStorage::InsertResult::CouldNotInsert) {
        // We need to add an item but no fixed storage remains to grow. Switch
        // to flexible.
        assert(fixed.used == N);
        assert(flexible.empty());
        flexible.insert(fixed.storage.begin(),
                        fixed.storage.begin() + fixed.used);
        flexible.insert(x);
        assert(!usingFixed());
        fixed.used = 0;
      }
    } else {
      flexible.insert(x);
    }
  }